

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_parse_cfg.c
# Opt level: O2

int lookup_opt_type(char *line)

{
  char *__s;
  long lVar1;
  int iVar2;
  size_t __n;
  long lVar3;
  
  lVar1 = -0x10;
  do {
    lVar3 = lVar1;
    if (lVar3 + 0x10 == 0x60) {
      return -1;
    }
    __s = *(char **)((long)&op_tbl[1].type_str + lVar3);
    __n = strlen(__s);
    iVar2 = strncmp(__s,line,__n);
    lVar1 = lVar3 + 0x10;
  } while (iVar2 != 0);
  _mpp_log_l(4,0,"option type %s find\n",0,__s);
  return *(int *)((long)&op_tbl[1].type + lVar3);
}

Assistant:

static int lookup_opt_type(char *line)
{
    size_t i;

    for (i = 0; i < ARRAY_SIZE(op_tbl); ++i) {
        if (!strncmp(op_tbl[i].type_str, line,
                     strlen(op_tbl[i].type_str))) {
            mpp_log("option type %s find\n", op_tbl[i].type_str);
            return op_tbl[i].type;
        }
    }

    return -1;
}